

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O0

bool spvtools::opt::IsLineInst(spv_parsed_instruction_t *inst)

{
  ushort uVar1;
  bool bVar2;
  bool local_25;
  NonSemanticShaderDebugInfo100Instructions ext_inst_key;
  uint32_t ext_inst_index;
  Op opcode;
  spv_parsed_instruction_t *inst_local;
  
  uVar1 = inst->opcode;
  bVar2 = IsOpLineInst((uint)uVar1);
  if (bVar2) {
    inst_local._7_1_ = true;
  }
  else {
    bVar2 = spvIsExtendedInstruction((uint)uVar1);
    if (bVar2) {
      if (inst->ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
        local_25 = inst->words[4] == 0x67 || inst->words[4] == 0x68;
        inst_local._7_1_ = local_25;
      }
      else {
        inst_local._7_1_ = false;
      }
    }
    else {
      inst_local._7_1_ = false;
    }
  }
  return inst_local._7_1_;
}

Assistant:

bool IsLineInst(const spv_parsed_instruction_t* inst) {
  const auto opcode = static_cast<spv::Op>(inst->opcode);
  if (IsOpLineInst(opcode)) return true;
  if (!spvIsExtendedInstruction(opcode)) return false;
  if (inst->ext_inst_type != SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)
    return false;
  const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
  const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
      NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
  return ext_inst_key == NonSemanticShaderDebugInfo100DebugLine ||
         ext_inst_key == NonSemanticShaderDebugInfo100DebugNoLine;
}